

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int uv_fs_futime(uv_loop_t *loop,uv_fs_t *req,uv_file file,double atime,double mtime,uv_fs_cb cb)

{
  long *plVar1;
  int iVar2;
  
  req->type = UV_FS;
  if (cb != (uv_fs_cb)0x0) {
    req->active_queue[0] = loop->active_reqs;
    plVar1 = (long *)loop->active_reqs[1];
    req->active_queue[1] = plVar1;
    *plVar1 = (long)req->active_queue;
    loop->active_reqs[1] = req->active_queue;
  }
  iVar2 = 0;
  req->fs_type = UV_FS_FUTIME;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  req->file = file;
  req->atime = atime;
  req->mtime = mtime;
  if (cb == (uv_fs_cb)0x0) {
    uv__fs_work(&req->work_req);
    iVar2 = (int)req->result;
  }
  else {
    uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
  }
  return iVar2;
}

Assistant:

int uv_fs_futime(uv_loop_t* loop,
                 uv_fs_t* req,
                 uv_file file,
                 double atime,
                 double mtime,
                 uv_fs_cb cb) {
  INIT(FUTIME);
  req->file = file;
  req->atime = atime;
  req->mtime = mtime;
  POST;
}